

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O2

bool __thiscall vmips::callfunc::used_register(callfunc *this,shared_ptr<vmips::VirtReg> *reg)

{
  VirtReg *this_00;
  shared_ptr<vmips::VirtReg> *psVar1;
  bool bVar2;
  __normal_iterator<const_std::shared_ptr<vmips::VirtReg>_*,_std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>_>
  __it;
  long lVar3;
  long lVar4;
  __normal_iterator<const_std::shared_ptr<vmips::VirtReg>_*,_std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>_>
  _Var5;
  shared_ptr<vmips::VirtReg> *local_38;
  
  this_00 = (this->ret).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((this_00 != (VirtReg *)0x0) &&
     (bVar2 = VirtReg::operator==(this_00,(reg->
                                          super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr), bVar2)) {
    return true;
  }
  __it._M_current =
       (this->call_with).
       super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->call_with).
           super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)psVar1 - (long)__it._M_current;
  local_38 = reg;
  for (lVar3 = lVar4 >> 6; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::$_0>
            ::operator()((_Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::__0>
                          *)&local_38,__it);
    _Var5._M_current = __it._M_current;
    if (bVar2) goto LAB_00125469;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::$_0>
            ::operator()((_Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::__0>
                          *)&local_38,__it._M_current + 1);
    _Var5._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_00125469;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::$_0>
            ::operator()((_Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::__0>
                          *)&local_38,__it._M_current + 2);
    _Var5._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_00125469;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::$_0>
            ::operator()((_Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::__0>
                          *)&local_38,__it._M_current + 3);
    _Var5._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_00125469;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x40;
  }
  lVar4 = lVar4 >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = psVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::$_0>
                  ::operator()((_Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::__0>
                                *)&local_38,__it), _Var5._M_current = __it._M_current, bVar2))
      goto LAB_00125469;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::$_0>
            ::operator()((_Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::__0>
                          *)&local_38,__it);
    _Var5._M_current = __it._M_current;
    if (bVar2) goto LAB_00125469;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::$_0>
          ::operator()((_Iter_pred<vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::__0>
                        *)&local_38,__it);
  _Var5._M_current = __it._M_current;
  if (!bVar2) {
    _Var5._M_current = psVar1;
  }
LAB_00125469:
  return _Var5._M_current != psVar1;
}

Assistant:

bool callfunc::used_register(const std::shared_ptr<VirtReg> &reg) const {
    if (ret && *ret == *reg) return true;
    return std::any_of(call_with.begin(), call_with.end(),
                       [&](const std::shared_ptr<VirtReg> &t) { return *t == *reg; });
}